

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int table_query(lua_State *L)

{
  lua_CFunction p_Var1;
  uint uVar2;
  int iVar3;
  lua_Integer lVar4;
  lua_Integer local_40;
  int local_2c;
  int i;
  Table *t;
  lua_State *L_local;
  
  lVar4 = luaL_optinteger(L,2,-1);
  uVar2 = (uint)lVar4;
  luaL_checktype(L,1,5);
  if (L->ci->func[1].tt_ != 0x8005) {
    __assert_fail("(((((L->ci->func + (1))))->tt_) == (((5) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x342,"int table_query(lua_State *)");
  }
  if ((L->ci->func[1].value_.gc)->tt != '\x05') {
    __assert_fail("((((L->ci->func + (1)))->value_).gc)->tt == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x342,"int table_query(lua_State *)");
  }
  p_Var1 = L->ci->func[1].value_.f;
  if (uVar2 == 0xffffffff) {
    lua_pushinteger(L,(ulong)*(uint *)(p_Var1 + 0xc));
    if (*(long *)(p_Var1 + 0x20) == 0) {
      local_2c = 0;
    }
    else {
      local_2c = 1 << ((byte)p_Var1[0xb] & 0x1f);
    }
    lua_pushinteger(L,(long)local_2c);
    if (*(long *)(p_Var1 + 0x20) == 0) {
      local_40 = 0;
    }
    else {
      local_40 = *(long *)(p_Var1 + 0x20) - *(long *)(p_Var1 + 0x18) >> 5;
    }
    lua_pushinteger(L,local_40);
  }
  else if (uVar2 < *(uint *)(p_Var1 + 0xc)) {
    lua_pushinteger(L,(long)(int)uVar2);
    pushobject(L,(TValue *)(*(long *)(p_Var1 + 0x10) + (long)(int)uVar2 * 0x10));
    lua_pushnil(L);
  }
  else {
    iVar3 = uVar2 - *(int *)(p_Var1 + 0xc);
    if (iVar3 < 1 << ((byte)p_Var1[0xb] & 0x1f)) {
      if (((*(short *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20 + 8) == 0) &&
          (*(short *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20 + 0x18) != 0)) &&
         ((*(ushort *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20 + 0x18) & 0xf) != 3)) {
        lua_pushstring(L,"<undef>");
      }
      else {
        pushobject(L,(TValue *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20 + 0x10));
      }
      pushobject(L,(TValue *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20));
      if (*(int *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20 + 0x1c) == 0) {
        lua_pushnil(L);
      }
      else {
        lua_pushinteger(L,(long)*(int *)(*(long *)(p_Var1 + 0x18) + (long)iVar3 * 0x20 + 0x1c));
      }
    }
  }
  return 3;
}

Assistant:

static int table_query (lua_State *L) {
  const Table *t;
  int i = cast_int(luaL_optinteger(L, 2, -1));
  luaL_checktype(L, 1, LUA_TTABLE);
  t = hvalue(obj_at(L, 1));
  if (i == -1) {
    lua_pushinteger(L, t->sizearray);
    lua_pushinteger(L, allocsizenode(t));
    lua_pushinteger(L, isdummy(t) ? 0 : t->lastfree - t->node);
  }
  else if ((unsigned int)i < t->sizearray) {
    lua_pushinteger(L, i);
    pushobject(L, &t->array[i]);
    lua_pushnil(L);
  }
  else if ((i -= t->sizearray) < sizenode(t)) {
    if (!ttisnil(gval(gnode(t, i))) ||
        ttisnil(gkey(gnode(t, i))) ||
        ttisnumber(gkey(gnode(t, i)))) {
      pushobject(L, gkey(gnode(t, i)));
    }
    else
      lua_pushliteral(L, "<undef>");
    pushobject(L, gval(gnode(t, i)));
    if (gnext(&t->node[i]) != 0)
      lua_pushinteger(L, gnext(&t->node[i]));
    else
      lua_pushnil(L);
  }
  return 3;
}